

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk88(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk88_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk88.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk88.version);
    if ((bios->power).unk88.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk88.offset + 1,&(bios->power).unk88.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk88.offset + 2,&(bios->power).unk88.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk88.offset + 3,&(bios->power).unk88.entriesnum);
      (bios->power).unk88.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk88.entriesnum;
      peVar5 = (envy_bios_power_unk88_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk88.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk88.rlen * (int)uVar6 +
             (uint)(bios->power).unk88.hlen + (bios->power).unk88.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown LOW POWER DI table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk88(struct envy_bios *bios) {
	struct envy_bios_power_unk88 *unk88 = &bios->power.unk88;
	int i, err = 0;

	if (!unk88->offset)
		return -EINVAL;

	bios_u8(bios, unk88->offset + 0x0, &unk88->version);
	switch(unk88->version) {
	case 0x10:
		err |= bios_u8(bios, unk88->offset + 0x1, &unk88->hlen);
		err |= bios_u8(bios, unk88->offset + 0x2, &unk88->rlen);
		err |= bios_u8(bios, unk88->offset + 0x3, &unk88->entriesnum);
		unk88->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown LOW POWER DI table version 0x%x\n", unk88->version);
		return -EINVAL;
	};

	err = 0;
	unk88->entries = malloc(unk88->entriesnum * sizeof(struct envy_bios_power_unk88_entry));
	for (i = 0; i < unk88->entriesnum; i++) {
		uint32_t data = unk88->offset + unk88->hlen + i * unk88->rlen;

		unk88->entries[i].offset = data;
	}

	return 0;
}